

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O2

char * __thiscall
icu_63::MaybeStackArray<char,_40>::resize
          (MaybeStackArray<char,_40> *this,int32_t newCapacity,int32_t length)

{
  char *__dest;
  
  if ((0 < newCapacity) &&
     (__dest = (char *)uprv_malloc_63((ulong)(uint)newCapacity), __dest != (char *)0x0)) {
    if (0 < length) {
      if (this->capacity < length) {
        length = this->capacity;
      }
      if (newCapacity <= length) {
        length = newCapacity;
      }
      memcpy(__dest,this->ptr,(long)length);
    }
    releaseArray(this);
    this->ptr = __dest;
    this->capacity = newCapacity;
    this->needToRelease = '\x01';
    return __dest;
  }
  return (char *)0x0;
}

Assistant:

inline T *MaybeStackArray<T, stackCapacity>::resize(int32_t newCapacity, int32_t length) {
    if(newCapacity>0) {
#if U_DEBUG && defined(UPRV_MALLOC_COUNT)
      ::fprintf(::stderr,"MaybeStacArray (resize) alloc %d * %lu\n", newCapacity,sizeof(T));
#endif
        T *p=(T *)uprv_malloc(newCapacity*sizeof(T));
        if(p!=NULL) {
            if(length>0) {
                if(length>capacity) {
                    length=capacity;
                }
                if(length>newCapacity) {
                    length=newCapacity;
                }
                uprv_memcpy(p, ptr, (size_t)length*sizeof(T));
            }
            releaseArray();
            ptr=p;
            capacity=newCapacity;
            needToRelease=TRUE;
        }
        return p;
    } else {
        return NULL;
    }
}